

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O0

int OBJ_obj2nid(ASN1_OBJECT *o)

{
  ASN1_OBJECT *pAVar1;
  ushort *puVar2;
  uint16_t *nid_ptr;
  ASN1_OBJECT *match;
  ASN1_OBJECT *obj_local;
  
  if (o == (ASN1_OBJECT *)0x0) {
    obj_local._4_4_ = 0;
  }
  else if (o->nid == 0) {
    CRYPTO_MUTEX_lock_read(&global_added_lock);
    if ((global_added_by_data == (lhash_st_ASN1_OBJECT *)0x0) ||
       (pAVar1 = lh_ASN1_OBJECT_retrieve(global_added_by_data,(ASN1_OBJECT *)o),
       pAVar1 == (ASN1_OBJECT *)0x0)) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      puVar2 = (ushort *)bsearch(o,kNIDsInOIDOrder,0x371,2,obj_cmp);
      if (puVar2 == (ushort *)0x0) {
        obj_local._4_4_ = 0;
      }
      else {
        pAVar1 = get_builtin_object((uint)*puVar2);
        obj_local._4_4_ = pAVar1->nid;
      }
    }
    else {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      obj_local._4_4_ = pAVar1->nid;
    }
  }
  else {
    obj_local._4_4_ = o->nid;
  }
  return obj_local._4_4_;
}

Assistant:

int OBJ_obj2nid(const ASN1_OBJECT *obj) {
  if (obj == NULL) {
    return NID_undef;
  }

  if (obj->nid != 0) {
    return obj->nid;
  }

  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_data != NULL) {
    ASN1_OBJECT *match;

    match = lh_ASN1_OBJECT_retrieve(global_added_by_data, obj);
    if (match != NULL) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return match->nid;
    }
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);

  const uint16_t *nid_ptr = reinterpret_cast<const uint16_t *>(
      bsearch(obj, kNIDsInOIDOrder, OPENSSL_ARRAY_SIZE(kNIDsInOIDOrder),
              sizeof(kNIDsInOIDOrder[0]), obj_cmp));
  if (nid_ptr == NULL) {
    return NID_undef;
  }

  return get_builtin_object(*nid_ptr)->nid;
}